

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O0

void Fxu_ListMatrixDelVariable(Fxu_Matrix *p,Fxu_Var *pLink)

{
  Fxu_ListVar *pList;
  Fxu_Var *pLink_local;
  Fxu_Matrix *p_local;
  
  if ((p->lVars).pHead == pLink) {
    (p->lVars).pHead = pLink->pNext;
  }
  if ((p->lVars).pTail == pLink) {
    (p->lVars).pTail = pLink->pPrev;
  }
  if (pLink->pPrev != (Fxu_Var *)0x0) {
    pLink->pPrev->pNext = pLink->pNext;
  }
  if (pLink->pNext != (Fxu_Var *)0x0) {
    pLink->pNext->pPrev = pLink->pPrev;
  }
  (p->lVars).nItems = (p->lVars).nItems + -1;
  return;
}

Assistant:

void Fxu_ListMatrixDelVariable( Fxu_Matrix * p, Fxu_Var * pLink )
{
    Fxu_ListVar * pList = &p->lVars;
    if ( pList->pHead == pLink )
         pList->pHead = pLink->pNext;
    if ( pList->pTail == pLink )
         pList->pTail = pLink->pPrev;
    if ( pLink->pPrev )
         pLink->pPrev->pNext = pLink->pNext;
    if ( pLink->pNext )
         pLink->pNext->pPrev = pLink->pPrev;
    pList->nItems--;
}